

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O1

void __thiscall Assimp::glTFExporter::ExportMeshes(glTFExporter *this)

{
  pointer *ppRVar1;
  Asset *pAVar2;
  element_type *peVar3;
  aiMesh *paVar4;
  pointer pPVar5;
  iterator iVar6;
  size_t sVar7;
  Buffer *pBVar8;
  Mesh *pMVar9;
  Skin *pSVar10;
  undefined8 *puVar11;
  Node *pNVar12;
  iterator __position;
  bool bVar13;
  vector<glTF::Skin_*,_std::allocator<glTF::Skin_*>_> *pvVar14;
  pointer paVar15;
  pointer paVar16;
  uchar *__src;
  unsigned_long uVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  aiScene *paVar22;
  Logger *this_00;
  vector<glTF::Mesh_*,_std::allocator<glTF::Mesh_*>_> *pvVar23;
  long lVar24;
  vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *pvVar25;
  void *pvVar26;
  _List_node_base *p_Var27;
  _List_node_base *p_Var28;
  PrimitiveMode PVar29;
  char *pcVar30;
  ulong uVar31;
  size_t *psVar32;
  ulong uVar33;
  int i;
  long lVar34;
  void *__dest;
  Ref<glTF::Buffer> RVar35;
  Ref<glTF::Skin> RVar36;
  Ref<glTF::Mesh> RVar37;
  Ref<glTF::Accessor> RVar38;
  Ref<glTF::Buffer> RStack_17798;
  uint uStack_17784;
  _List_node_base *p_Stack_17780;
  Ref<glTF::Skin> RStack_17778;
  vector<unsigned_long,_std::allocator<unsigned_long>_> idx_srcdata_tc;
  size_t sStack_17750;
  string meshId;
  vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> inverseBindMatricesData;
  Ref<glTF::Mesh> RStack_17700;
  element_type *peStack_176f0;
  __shared_ptr<unsigned_char,(__gnu_cxx::_Lock_policy)2> *p_Stack_176e8;
  ulong uStack_176e0;
  ulong uStack_176d8;
  Ref<glTF::Accessor> RStack_176d0;
  Ref<glTF::Accessor> RStack_176c0;
  string skinName;
  string sStack_17690;
  BinaryStream bs;
  string bufferId;
  string bufferIdPrefix;
  string fname;
  SC3DMCEncodeParams comp_o3dgc_params;
  string msg;
  undefined1 auStack_15920 [8296];
  vector<unsigned_short,_std::allocator<unsigned_short>_> indices;
  ulong uStack_13850;
  ios_base aiStack_13848 [8];
  undefined4 auStack_13840 [512];
  ulong auStack_13040 [512];
  ulong auStack_12040 [8704];
  long alStack_1040 [512];
  undefined8 local_40;
  
  idx_srcdata_tc.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  idx_srcdata_tc.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  idx_srcdata_tc.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fname,this->mFilename,(allocator<char> *)&indices);
  std::__cxx11::string::rfind((char *)&fname,0x6ccd24,0xffffffffffffffff);
  std::__cxx11::string::substr((ulong)&bufferIdPrefix,(ulong)&fname);
  pAVar2 = (this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&indices,"");
  glTF::Asset::FindUniqueID(&bufferId,pAVar2,(string *)&indices,bufferIdPrefix._M_dataplus._M_p);
  if ((pointer *)
      indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start !=
      &indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage) {
    operator_delete(indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)indices.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  }
  peVar3 = (this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  RStack_17798.vector = (peVar3->mBodyBuffer).vector;
  RStack_17798.index = (peVar3->mBodyBuffer).index;
  if (RStack_17798.vector == (vector<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_> *)0x0) {
    RVar35 = glTF::LazyDict<glTF::Buffer>::Create(&peVar3->buffers,bufferId._M_dataplus._M_p);
    RStack_17798.vector = RVar35.vector;
    RStack_17798.index = RVar35.index;
  }
  uVar19 = this->mScene->mNumMeshes;
  if (uVar19 == 0) {
    uStack_17784 = 0;
  }
  else {
    uStack_17784 = 0;
    lVar34 = 0;
    do {
      paVar4 = this->mScene->mMeshes[lVar34];
      if (paVar4->mBones != (aiBone **)0x0 && paVar4->mNumBones != 0) {
        uStack_17784 = 1;
        break;
      }
      iVar18 = (int)lVar34;
      lVar34 = lVar34 + 1;
    } while (uVar19 - 1 != iVar18);
  }
  RStack_17778.vector = (vector<glTF::Skin_*,_std::allocator<glTF::Skin_*>_> *)0x0;
  RStack_17778.index = 0;
  pAVar2 = (this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&indices,"skin","");
  glTF::Asset::FindUniqueID(&skinName,pAVar2,(string *)&indices,"skin");
  if ((pointer *)
      indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start !=
      &indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage) {
    operator_delete(indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)indices.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  }
  inverseBindMatricesData.
  super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  inverseBindMatricesData.
  super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  inverseBindMatricesData.
  super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((uStack_17784 & 1) != 0) {
    RVar36 = glTF::LazyDict<glTF::Skin>::Create
                       (&((this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->skins,skinName._M_dataplus._M_p);
    RStack_17778.vector = RVar36.vector;
    RStack_17778.index = RVar36.index;
    std::__cxx11::string::_M_assign
              ((string *)
               &((RStack_17778.vector)->
                super__Vector_base<glTF::Skin_*,_std::allocator<glTF::Skin_*>_>)._M_impl.
                super__Vector_impl_data._M_start[RStack_17778.index]->name);
  }
  paVar22 = this->mScene;
  if (paVar22->mNumMeshes != 0) {
    sStack_17750 = 0xffffffffffffffff;
    uVar31 = 0;
    p_Stack_17780 = (_List_node_base *)0x0;
    do {
      paVar4 = paVar22->mMeshes[uVar31];
      uStack_176d8 = uVar31;
      iVar18 = ExportProperties::GetPropertyInteger(this->mProperties,"extensions.Open3DGC.use",0);
      if ((((iVar18 == 0) || (paVar4->mPrimitiveTypes != 4)) || (paVar4->mNumVertices == 0)) ||
         (paVar4->mNumFaces == 0)) {
        msg._M_dataplus._M_p = (pointer)&msg.field_2;
        msg._M_string_length = 0;
        msg.field_2._M_local_buf[0] = '\0';
        pcVar30 = "all primitives of the mesh must be a triangles.";
        if (paVar4->mPrimitiveTypes == 4) {
          pcVar30 = "mesh must has vertices and faces.";
        }
        std::__cxx11::string::_M_replace((ulong)&msg,0,(char *)0x0,(ulong)pcVar30);
        this_00 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[41]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&indices,
                   (char (*) [41])"GLTF: can not use Open3DGC-compression: ");
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&indices,msg._M_dataplus._M_p,msg._M_string_length);
        std::__cxx11::stringbuf::str();
        Logger::warn(this_00,(char *)comp_o3dgc_params.m_numFloatAttributes);
        if ((unsigned_long *)comp_o3dgc_params.m_numFloatAttributes !=
            &comp_o3dgc_params.m_coordQuantBits) {
          operator_delete((void *)comp_o3dgc_params.m_numFloatAttributes,
                          comp_o3dgc_params.m_coordQuantBits + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&indices);
        std::ios_base::~ios_base(aiStack_13848);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,
                          CONCAT71(msg.field_2._M_allocated_capacity._1_7_,
                                   msg.field_2._M_local_buf[0]) + 1);
        }
        bVar13 = false;
      }
      else {
        if (idx_srcdata_tc.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
            .super__Vector_impl_data._M_finish !=
            idx_srcdata_tc.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
            .super__Vector_impl_data._M_start) {
          idx_srcdata_tc.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               idx_srcdata_tc.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
        }
        bVar13 = true;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&idx_srcdata_tc,8);
      }
      pAVar2 = (this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&indices,(paVar4->mName).data,(allocator<char> *)&msg);
      glTF::Asset::FindUniqueID(&meshId,pAVar2,(string *)&indices,"mesh");
      if ((pointer *)
          indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start !=
          &indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage) {
        operator_delete(indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)indices.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
      }
      RVar37 = glTF::LazyDict<glTF::Mesh>::Create
                         (&((this->mAsset).
                            super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                           meshes,meshId._M_dataplus._M_p);
      pvVar23 = RVar37.vector;
      uVar19 = RVar37.index;
      RStack_17700.vector = pvVar23;
      RStack_17700.index = uVar19;
      std::vector<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>::resize
                (&(pvVar23->super__Vector_base<glTF::Mesh_*,_std::allocator<glTF::Mesh_*>_>)._M_impl
                  .super__Vector_impl_data._M_start[uVar19]->primitives,1);
      pPVar5 = *(pointer *)
                ((long)&((pvVar23->super__Vector_base<glTF::Mesh_*,_std::allocator<glTF::Mesh_*>_>).
                         _M_impl.super__Vector_impl_data._M_start[uVar19]->primitives).
                        super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
                        ._M_impl + 8);
      uVar19 = paVar4->mMaterialIndex;
      pPVar5[-1].material.vector =
           &(((this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            materials).mObjs;
      pPVar5[-1].material.index = uVar19;
      if (bVar13) {
        p_Stack_17780 =
             (_List_node_base *)
             ((RStack_17798.vector)->
             super__Vector_base<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_>)._M_impl.
             super__Vector_impl_data._M_start[RStack_17798.index]->byteLength;
      }
      RVar38 = ExportData((this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,&meshId,&RStack_17798,paVar4->mNumVertices,paVar4->mVertices,VEC3,
                          VEC3,ComponentType_FLOAT,false);
      RStack_176c0.vector = RVar38.vector;
      RStack_176c0.index = RVar38.index;
      if (RStack_176c0.vector != (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)0x0)
      {
        iVar6._M_current =
             *(pointer *)
              ((long)&pPVar5[-1].attributes.position.
                      super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
              + 8);
        if (iVar6._M_current ==
            *(pointer *)
             ((long)&pPVar5[-1].attributes.position.
                     super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
             + 0x10)) {
          std::vector<glTF::Ref<glTF::Accessor>,std::allocator<glTF::Ref<glTF::Accessor>>>::
          _M_realloc_insert<glTF::Ref<glTF::Accessor>const&>
                    ((vector<glTF::Ref<glTF::Accessor>,std::allocator<glTF::Ref<glTF::Accessor>>> *)
                     &pPVar5[-1].attributes,iVar6,&RStack_176c0);
        }
        else {
          (iVar6._M_current)->vector = RStack_176c0.vector;
          *(ulong *)&(iVar6._M_current)->index = CONCAT44(RStack_176c0._12_4_,RStack_176c0.index);
          ppRVar1 = (pointer *)
                    ((long)&pPVar5[-1].attributes.position.
                            super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                    + 8);
          *ppRVar1 = *ppRVar1 + 1;
        }
      }
      if ((bVar13) && (paVar4->mNormals != (aiVector3D *)0x0)) {
        sStack_17750 = ((RStack_17798.vector)->
                       super__Vector_base<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_>)._M_impl.
                       super__Vector_impl_data._M_start[RStack_17798.index]->byteLength;
      }
      RVar38 = ExportData((this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr,&meshId,&RStack_17798,paVar4->mNumVertices,paVar4->mNormals,VEC3,
                          VEC3,ComponentType_FLOAT,false);
      RStack_176d0.vector = RVar38.vector;
      RStack_176d0.index = RVar38.index;
      if (RStack_176d0.vector != (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)0x0)
      {
        iVar6._M_current =
             *(pointer *)
              ((long)&pPVar5[-1].attributes.normal.
                      super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
              + 8);
        if (iVar6._M_current ==
            *(pointer *)
             ((long)&pPVar5[-1].attributes.normal.
                     super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
             + 0x10)) {
          std::vector<glTF::Ref<glTF::Accessor>,std::allocator<glTF::Ref<glTF::Accessor>>>::
          _M_realloc_insert<glTF::Ref<glTF::Accessor>const&>
                    ((vector<glTF::Ref<glTF::Accessor>,std::allocator<glTF::Ref<glTF::Accessor>>> *)
                     &pPVar5[-1].attributes.normal,iVar6,&RStack_176d0);
        }
        else {
          RStack_176d0.vector._0_4_ = RVar38.vector._0_4_;
          RStack_176d0.vector._4_4_ = RVar38.vector._4_4_;
          *(undefined4 *)&(iVar6._M_current)->vector = RStack_176d0.vector._0_4_;
          *(undefined4 *)((long)&(iVar6._M_current)->vector + 4) = RStack_176d0.vector._4_4_;
          (iVar6._M_current)->index = RStack_176d0.index;
          *(undefined4 *)&(iVar6._M_current)->field_0xc = RStack_176d0._12_4_;
          ppRVar1 = (pointer *)
                    ((long)&pPVar5[-1].attributes.normal.
                            super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                    + 8);
          *ppRVar1 = *ppRVar1 + 1;
        }
      }
      lVar34 = 0;
      do {
        if ((1 < paVar4->mNumUVComponents[lVar34]) && (paVar4->mNumVertices != 0)) {
          lVar24 = 4;
          uVar31 = 0;
          do {
            *(float *)((long)&paVar4->mTextureCoords[lVar34]->x + lVar24) =
                 1.0 - *(float *)((long)&paVar4->mTextureCoords[lVar34]->x + lVar24);
            uVar31 = uVar31 + 1;
            lVar24 = lVar24 + 0xc;
          } while (uVar31 < paVar4->mNumVertices);
        }
        uVar19 = paVar4->mNumUVComponents[lVar34];
        if (uVar19 != 0) {
          if (bVar13) {
            psVar32 = &((RStack_17798.vector)->
                       super__Vector_base<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_>)._M_impl.
                       super__Vector_impl_data._M_start[RStack_17798.index]->byteLength;
            if (idx_srcdata_tc.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish ==
                idx_srcdata_tc.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>
                        ((vector<unsigned_long,std::allocator<unsigned_long>> *)&idx_srcdata_tc,
                         (iterator)
                         idx_srcdata_tc.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish,psVar32);
            }
            else {
              *idx_srcdata_tc.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_finish = *psVar32;
              idx_srcdata_tc.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   idx_srcdata_tc.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish + 1;
            }
          }
          RVar38 = ExportData((this->mAsset).
                              super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                              &meshId,&RStack_17798,paVar4->mNumVertices,
                              paVar4->mTextureCoords[lVar34],VEC3,(uVar19 != 2) + VEC2,
                              ComponentType_FLOAT,false);
          pvVar25 = RVar38.vector;
          indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)CONCAT44(indices.
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._4_4_,RVar38.index);
          indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)pvVar25;
          if (pvVar25 != (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)0x0) {
            iVar6._M_current =
                 *(pointer *)
                  ((long)&pPVar5[-1].attributes.texcoord.
                          super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                  + 8);
            if (iVar6._M_current ==
                *(pointer *)
                 ((long)&pPVar5[-1].attributes.texcoord.
                         super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                 + 0x10)) {
              std::vector<glTF::Ref<glTF::Accessor>,std::allocator<glTF::Ref<glTF::Accessor>>>::
              _M_realloc_insert<glTF::Ref<glTF::Accessor>const&>
                        ((vector<glTF::Ref<glTF::Accessor>,std::allocator<glTF::Ref<glTF::Accessor>>>
                          *)&pPVar5[-1].attributes.texcoord,iVar6,(Ref<glTF::Accessor> *)&indices);
            }
            else {
              indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start._0_4_ = RVar38.vector._0_4_;
              indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_start._4_4_ = RVar38.vector._4_4_;
              *(undefined4 *)&(iVar6._M_current)->vector =
                   indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_start._0_4_;
              *(undefined4 *)((long)&(iVar6._M_current)->vector + 4) =
                   indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_start._4_4_;
              (iVar6._M_current)->index = RVar38.index;
              *(undefined4 *)&(iVar6._M_current)->field_0xc =
                   indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_finish._4_4_;
              ppRVar1 = (pointer *)
                        ((long)&pPVar5[-1].attributes.texcoord.
                                super__Vector_base<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>
                        + 8);
              *ppRVar1 = *ppRVar1 + 1;
            }
          }
        }
        lVar34 = lVar34 + 1;
      } while (lVar34 != 8);
      sVar7 = ((RStack_17798.vector)->
              super__Vector_base<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_>)._M_impl.
              super__Vector_impl_data._M_start[RStack_17798.index]->byteLength;
      if (paVar4->mNumFaces != 0) {
        indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar19 = paVar4->mFaces->mNumIndices;
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
                  (&indices,(ulong)(paVar4->mNumFaces * uVar19));
        if (paVar4->mNumFaces != 0) {
          lVar34 = 0;
          uVar31 = 0;
          do {
            if (uVar19 != 0) {
              uVar33 = 0;
              do {
                *(short *)((long)indices.
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 ._M_impl.super__Vector_impl_data._M_start + uVar33 * 2 + lVar34) =
                     (short)paVar4->mFaces[uVar31].mIndices[uVar33];
                uVar33 = uVar33 + 1;
              } while (uVar19 != uVar33);
            }
            uVar31 = uVar31 + 1;
            lVar34 = lVar34 + (ulong)uVar19 * 2;
          } while (uVar31 < paVar4->mNumFaces);
        }
        RVar38 = ExportData((this->mAsset).
                            super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            &meshId,&RStack_17798,
                            (uint)((ulong)((long)indices.
                                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)indices.
                                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 1),
                            indices.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start,SCALAR,SCALAR,
                            ComponentType_UNSIGNED_SHORT,true);
        pPVar5[-1].indices.vector = RVar38.vector;
        pPVar5[-1].indices.index = RVar38.index;
        if (indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(indices.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)indices.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)indices.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      PVar29 = (uint)(paVar4->mPrimitiveTypes != 2) * 3 + PrimitiveMode_LINES;
      if (paVar4->mPrimitiveTypes == 1) {
        PVar29 = PrimitiveMode_POINTS;
      }
      pPVar5[-1].mode = PVar29;
      if ((paVar4->mBones != (aiBone **)0x0) && (paVar4->mNumBones != 0)) {
        ExportSkin((this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   ,paVar4,&RStack_17700,&RStack_17798,&RStack_17778,&inverseBindMatricesData);
      }
      if (bVar13) {
        o3dgc::BinaryStream::BinaryStream(&bs,0x1000);
        o3dgc::TriangleListEncoder<unsigned_short>::TriangleListEncoder
                  ((TriangleListEncoder<unsigned_short> *)&msg);
        memset(auStack_15920,0,0x2064);
        memset(&indices,0,80000);
        local_40._0_4_ = 30.0;
        local_40._4_1_ = true;
        local_40._5_1_ = true;
        local_40._6_1_ = true;
        local_40._7_1_ = true;
        memset(&comp_o3dgc_params,0,0x1030);
        comp_o3dgc_params.m_encodeMode = O3DGC_SC3DMC_ENCODE_MODE_TFAN;
        comp_o3dgc_params.m_streamTypeMode = O3DGC_STREAM_TYPE_ASCII;
        comp_o3dgc_params.m_coordQuantBits = 0xe;
        comp_o3dgc_params.m_normalQuantBits = 8;
        comp_o3dgc_params.m_coordPredMode = O3DGC_SC3DMC_PARALLELOGRAM_PREDICTION;
        comp_o3dgc_params.m_normalPredMode = O3DGC_SC3DMC_SURF_NORMALS_PREDICTION;
        lVar34 = 0x20a;
        do {
          *(undefined4 *)((long)comp_o3dgc_params.m_floatAttributeQuantBits + lVar34 * 4 + -0x20) =
               1;
          lVar34 = lVar34 + 1;
        } while (lVar34 != 0x30a);
        memset(comp_o3dgc_params.m_intAttributePredMode,0,0x400);
        uVar19 = ExportProperties::GetPropertyInteger
                           (this->mProperties,"extensions.Open3DGC.quantization.POSITION",0xc);
        uVar31 = (ulong)uVar19;
        uVar20 = ExportProperties::GetPropertyInteger
                           (this->mProperties,"extensions.Open3DGC.quantization.NORMAL",10);
        uVar21 = ExportProperties::GetPropertyInteger
                           (this->mProperties,"extensions.Open3DGC.quantization.TEXCOORD",10);
        local_40._4_1_ = true;
        local_40._7_1_ = true;
        uStack_13850 = 0;
        comp_o3dgc_params.m_coordPredMode = O3DGC_SC3DMC_PARALLELOGRAM_PREDICTION;
        uVar19 = paVar4->mNumVertices;
        if (sStack_17750 != 0xffffffffffffffff) {
          comp_o3dgc_params.m_normalQuantBits = (unsigned_long)uVar20;
          comp_o3dgc_params.m_coordPredMode = O3DGC_SC3DMC_PARALLELOGRAM_PREDICTION;
          comp_o3dgc_params.m_normalPredMode = O3DGC_SC3DMC_SURF_NORMALS_PREDICTION;
        }
        comp_o3dgc_params.m_coordQuantBits = uVar31;
        if ((long)idx_srcdata_tc.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)idx_srcdata_tc.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start != 0) {
          lVar34 = (long)idx_srcdata_tc.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)idx_srcdata_tc.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3;
          lVar24 = 0;
          do {
            if (0xff < uStack_13850) {
              __assert_fail("a < O3DGC_SC3DMC_MAX_NUM_FLOAT_ATTRIBUTES",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/Open3DGC/o3dgcSC3DMCEncodeParams.h"
                            ,0x6d,
                            "void o3dgc::SC3DMCEncodeParams::SetFloatAttributeQuantBits(unsigned long, unsigned long)"
                           );
            }
            comp_o3dgc_params.m_floatAttributeQuantBits[uStack_13850] = (ulong)uVar21;
            comp_o3dgc_params.m_floatAttributePredMode[uStack_13850] =
                 O3DGC_SC3DMC_PARALLELOGRAM_PREDICTION;
            auStack_13040[uStack_13850] = (ulong)paVar4->mNumVertices;
            auStack_12040[uStack_13850] = (ulong)paVar4->mNumUVComponents[lVar24];
            auStack_13840[uStack_13850] = 4;
            alStack_1040[uStack_13850] =
                 (long)((((RStack_17798.vector)->
                         super__Vector_base<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_>).
                         _M_impl.super__Vector_impl_data._M_start[RStack_17798.index]->mData).
                        super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                       idx_srcdata_tc.
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar24]);
            if (uStack_13850 == 0xff) {
              __assert_fail("numFloatAttributes < O3DGC_SC3DMC_MAX_NUM_FLOAT_ATTRIBUTES",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/Open3DGC/o3dgcIndexedFaceSet.h"
                            ,0x97,
                            "void o3dgc::IndexedFaceSet<unsigned short>::SetNumFloatAttributes(unsigned long) [T = unsigned short]"
                           );
            }
            uStack_13850 = uStack_13850 + 1;
            lVar24 = lVar24 + 1;
          } while (lVar34 + (ulong)(lVar34 == 0) != lVar24);
        }
        indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)(ulong)paVar4->mNumFaces;
        indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pointer)((((RStack_17798.vector)->
                        super__Vector_base<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_>)._M_impl
                        .super__Vector_impl_data._M_start[RStack_17798.index]->mData).
                       super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr + sVar7)
        ;
        if (0xff < uStack_13850) {
          __assert_fail("numFloatAttributes < O3DGC_SC3DMC_MAX_NUM_FLOAT_ATTRIBUTES",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/Open3DGC/o3dgcSC3DMCEncodeParams.h"
                        ,0x61,"void o3dgc::SC3DMCEncodeParams::SetNumFloatAttributes(unsigned long)"
                       );
        }
        comp_o3dgc_params.m_numFloatAttributes = uStack_13850;
        iVar18 = ExportProperties::GetPropertyInteger
                           (this->mProperties,"extensions.Open3DGC.binary",1);
        comp_o3dgc_params.m_streamTypeMode = O3DGC_STREAM_TYPE_BINARY - (iVar18 == 0);
        o3dgc::IndexedFaceSet<unsigned_short>::ComputeMinMax
                  ((IndexedFaceSet<unsigned_short> *)&indices,O3DGC_SC3DMC_MAX_ALL_DIMS);
        o3dgc::SC3DMCEncoder<unsigned_short>::Encode
                  ((SC3DMCEncoder<unsigned_short> *)&msg,&comp_o3dgc_params,
                   (IndexedFaceSet<unsigned_short> *)&indices,&bs);
        uVar17 = bs.m_stream.m_size;
        __src = bs.m_stream.m_buffer;
        if (bs.m_stream.m_buffer != (uchar *)0x0) {
          pBVar8 = ((RStack_17798.vector)->
                   super__Vector_base<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[RStack_17798.index];
          p_Var27 = (_List_node_base *)pBVar8->byteLength;
          if ((p_Var27 != p_Stack_17780) && (bs.m_stream.m_size != 0)) {
            uStack_176e0 = (long)&p_Stack_17780->_M_next + bs.m_stream.m_size;
            pvVar26 = operator_new__(uStack_176e0);
            p_Var28 = p_Stack_17780;
            p_Stack_176e8 = (__shared_ptr<unsigned_char,(__gnu_cxx::_Lock_policy)2> *)&pBVar8->mData
            ;
            peStack_176f0 =
                 (pBVar8->mData).super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
            memcpy(pvVar26,peStack_176f0,(size_t)p_Stack_17780);
            __dest = (void *)((long)pvVar26 + (long)p_Var28);
            memcpy(__dest,__src,uVar17);
            memcpy((void *)((long)__dest + uVar17),
                   (element_type *)((long)&p_Var27->_M_next + (long)peStack_176f0),(size_t)p_Var28);
            std::__shared_ptr<unsigned_char,(__gnu_cxx::_Lock_policy)2>::
            reset<unsigned_char,std::default_delete<unsigned_char[]>>(p_Stack_176e8,pvVar26);
            pBVar8->byteLength = uStack_176e0;
          }
        }
        p_Var27 = (_List_node_base *)operator_new(0x58);
        *(undefined4 *)&p_Var27->_M_prev = 0;
        p_Var27->_M_next = (_List_node_base *)&PTR__SCompression_Open3DGC_0082c780;
        p_Var27[1]._M_next = p_Var27 + 2;
        p_Var27[1]._M_prev = (_List_node_base *)0x0;
        *(undefined1 *)&p_Var27[2]._M_next = 0;
        std::__cxx11::string::_M_assign((string *)(p_Var27 + 1));
        p_Var27[3]._M_next = p_Stack_17780;
        p_Var27[3]._M_prev =
             (_List_node_base *)
             (((RStack_17798.vector)->
              super__Vector_base<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_>)._M_impl.
              super__Vector_impl_data._M_start[RStack_17798.index]->byteLength - (long)p_Stack_17780
             );
        iVar18 = ExportProperties::GetPropertyInteger
                           (this->mProperties,"extensions.Open3DGC.binary",0);
        *(bool *)&p_Var27[4]._M_next = iVar18 != 0;
        p_Var27[4]._M_prev =
             (_List_node_base *)
             ((long)indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start * 3);
        p_Var27[5]._M_next = (_List_node_base *)(ulong)uVar19;
        pMVar9 = ((RStack_17700.vector)->
                 super__Vector_base<glTF::Mesh_*,_std::allocator<glTF::Mesh_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[RStack_17700.index];
        p_Var28 = (_List_node_base *)operator_new(0x18);
        p_Var28[1]._M_next = p_Var27;
        std::__detail::_List_node_base::_M_hook(p_Var28);
        psVar32 = (size_t *)
                  ((long)&(pMVar9->Extension).
                          super__List_base<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_>
                          ._M_impl + 0x10);
        *psVar32 = *psVar32 + 1;
        o3dgc::SC3DMCEncoder<unsigned_short>::~SC3DMCEncoder((SC3DMCEncoder<unsigned_short> *)&msg);
        if (bs.m_stream.m_buffer != (uchar *)0x0) {
          operator_delete__(bs.m_stream.m_buffer);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)meshId._M_dataplus._M_p != &meshId.field_2) {
        operator_delete(meshId._M_dataplus._M_p,meshId.field_2._M_allocated_capacity + 1);
      }
      uVar31 = uStack_176d8 + 1;
      paVar22 = this->mScene;
    } while (uVar31 < paVar22->mNumMeshes);
  }
  paVar16 = inverseBindMatricesData.
            super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>._M_impl.
            super__Vector_impl_data._M_finish;
  paVar15 = inverseBindMatricesData.
            super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((uStack_17784 & 1) != 0) {
    uVar31 = (long)inverseBindMatricesData.
                   super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)inverseBindMatricesData.
                   super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 6;
    pvVar26 = operator_new__(-(ulong)(uVar31 >> 0x3a != 0) |
                             (long)inverseBindMatricesData.
                                   super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)inverseBindMatricesData.
                                   super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
    if (paVar16 != paVar15) {
      uVar19 = 1;
      uVar33 = 0;
      do {
        CopyValue(paVar15 + uVar33,(mat4 *)(uVar33 * 0x40 + (long)pvVar26));
        uVar33 = (ulong)uVar19;
        uVar19 = uVar19 + 1;
      } while (uVar33 < uVar31);
    }
    RVar38 = ExportData((this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>.
                        _M_ptr,&skinName,&RStack_17798,(uint)uVar31,pvVar26,MAT4,MAT4,
                        ComponentType_FLOAT,false);
    pvVar14 = RStack_17778.vector;
    if (RVar38.vector != (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)0x0) {
      pSVar10 = ((RStack_17778.vector)->
                super__Vector_base<glTF::Skin_*,_std::allocator<glTF::Skin_*>_>)._M_impl.
                super__Vector_impl_data._M_start[RStack_17778.index];
      (pSVar10->inverseBindMatrices).vector = RVar38.vector;
      (pSVar10->inverseBindMatrices).index = RVar38.index;
    }
    uVar31 = (ulong)RStack_17778.index;
    (((RStack_17778.vector)->super__Vector_base<glTF::Skin_*,_std::allocator<glTF::Skin_*>_>).
     _M_impl.super__Vector_impl_data._M_start[uVar31]->bindShapeMatrix).isPresent = true;
    pSVar10 = ((RStack_17778.vector)->
              super__Vector_base<glTF::Skin_*,_std::allocator<glTF::Skin_*>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar31];
    (pSVar10->bindShapeMatrix).value[0] = 1.0;
    (pSVar10->bindShapeMatrix).value[1] = 0.0;
    (pSVar10->bindShapeMatrix).value[2] = 0.0;
    (pSVar10->bindShapeMatrix).value[3] = 0.0;
    (pSVar10->bindShapeMatrix).value[4] = 0.0;
    (pSVar10->bindShapeMatrix).value[5] = 1.0;
    (pSVar10->bindShapeMatrix).value[6] = 0.0;
    (pSVar10->bindShapeMatrix).value[7] = 0.0;
    (pSVar10->bindShapeMatrix).value[8] = 0.0;
    (pSVar10->bindShapeMatrix).value[9] = 0.0;
    (pSVar10->bindShapeMatrix).value[10] = 1.0;
    (pSVar10->bindShapeMatrix).value[0xb] = 0.0;
    (pSVar10->bindShapeMatrix).value[0xc] = 0.0;
    (pSVar10->bindShapeMatrix).value[0xd] = 0.0;
    (pSVar10->bindShapeMatrix).value[0xe] = 0.0;
    (pSVar10->bindShapeMatrix).value[0xf] = 1.0;
    peVar3 = (this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    msg._M_dataplus._M_p = (pointer)&(peVar3->nodes).mObjs;
    msg._M_string_length = msg._M_string_length & 0xffffffff00000000;
    comp_o3dgc_params.m_numFloatAttributes = 0;
    comp_o3dgc_params.m_numIntAttributes._0_4_ = 0;
    pMVar9 = *(peVar3->meshes).mObjs.super__Vector_base<glTF::Mesh_*,_std::allocator<glTF::Mesh_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)&indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
    lVar34 = *(long *)&((string *)((long)&pMVar9->super_Object + 8))->_M_dataplus;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&indices,lVar34,*(size_type *)((long)&pMVar9->super_Object + 0x10) + lVar34
              );
    sStack_17690._M_dataplus._M_p = (pointer)&sStack_17690.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sStack_17690,
               indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start,
               (long)indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_finish +
               (long)indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_start);
    FindMeshNode((Ref<glTF::Node> *)&msg,(Ref<glTF::Node> *)&comp_o3dgc_params,&sStack_17690);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sStack_17690._M_dataplus._M_p != &sStack_17690.field_2) {
      operator_delete(sStack_17690._M_dataplus._M_p,sStack_17690.field_2._M_allocated_capacity + 1);
    }
    uVar17 = comp_o3dgc_params.m_numFloatAttributes;
    puVar11 = *(undefined8 **)
               &((pvVar14->super__Vector_base<glTF::Skin_*,_std::allocator<glTF::Skin_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar31]->jointNames).
                super__Vector_base<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>.
                _M_impl.super__Vector_impl_data;
    meshId._M_dataplus._M_p = (pointer)*puVar11;
    uVar31 = (ulong)*(uint *)(puVar11 + 1);
    do {
      pNVar12 = (((vector<glTF::Node_*,_std::allocator<glTF::Node_*>_> *)meshId._M_dataplus._M_p)->
                super__Vector_base<glTF::Node_*,_std::allocator<glTF::Node_*>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar31];
      meshId._M_dataplus._M_p = (pointer)(pNVar12->parent).vector;
      meshId._M_string_length._0_4_ = (pNVar12->parent).index;
      uVar31 = (ulong)(uint)meshId._M_string_length;
    } while (((((vector<glTF::Node_*,_std::allocator<glTF::Node_*>_> *)meshId._M_dataplus._M_p)->
              super__Vector_base<glTF::Node_*,_std::allocator<glTF::Node_*>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar31]->jointName)._M_string_length != 0);
    uVar31 = (ulong)(uint)comp_o3dgc_params.m_numIntAttributes;
    lVar34 = *(long *)(*(long *)comp_o3dgc_params.m_numFloatAttributes + uVar31 * 8);
    __position._M_current = *(Ref<glTF::Node> **)(lVar34 + 0x118);
    if (__position._M_current == *(Ref<glTF::Node> **)(lVar34 + 0x120)) {
      std::vector<glTF::Ref<glTF::Node>,std::allocator<glTF::Ref<glTF::Node>>>::
      _M_realloc_insert<glTF::Ref<glTF::Node>const&>
                ((vector<glTF::Ref<glTF::Node>,std::allocator<glTF::Ref<glTF::Node>>> *)
                 (lVar34 + 0x110),__position,(Ref<glTF::Node> *)&meshId);
    }
    else {
      (__position._M_current)->vector =
           (vector<glTF::Node_*,_std::allocator<glTF::Node_*>_> *)meshId._M_dataplus._M_p;
      *(ulong *)&(__position._M_current)->index =
           CONCAT44(meshId._M_string_length._4_4_,(uint)meshId._M_string_length);
      *(long *)(lVar34 + 0x118) = *(long *)(lVar34 + 0x118) + 0x10;
    }
    lVar34 = *(long *)(*(long *)uVar17 + uVar31 * 8);
    *(uint *)(lVar34 + 0x130) = RStack_17778.index;
    *(vector<glTF::Skin_*,_std::allocator<glTF::Skin_*>_> **)(lVar34 + 0x128) = RStack_17778.vector;
    if ((pointer *)
        indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start !=
        &indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage) {
      operator_delete(indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)indices.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 1);
    }
  }
  if (inverseBindMatricesData.
      super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(inverseBindMatricesData.
                    super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)inverseBindMatricesData.
                          super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)inverseBindMatricesData.
                          super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)skinName._M_dataplus._M_p != &skinName.field_2) {
    operator_delete(skinName._M_dataplus._M_p,skinName.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)bufferId._M_dataplus._M_p != &bufferId.field_2) {
    operator_delete(bufferId._M_dataplus._M_p,bufferId.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)bufferIdPrefix._M_dataplus._M_p != &bufferIdPrefix.field_2) {
    operator_delete(bufferIdPrefix._M_dataplus._M_p,bufferIdPrefix.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)fname._M_dataplus._M_p != &fname.field_2) {
    operator_delete(fname._M_dataplus._M_p,fname.field_2._M_allocated_capacity + 1);
  }
  if (idx_srcdata_tc.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(idx_srcdata_tc.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)idx_srcdata_tc.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)idx_srcdata_tc.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void glTFExporter::ExportMeshes()
{
    // Not for
    //     using IndicesType = decltype(aiFace::mNumIndices);
    // But yes for
    //     using IndicesType = unsigned short;
    // because "ComponentType_UNSIGNED_SHORT" used for indices. And it's a maximal type according to glTF specification.
    typedef unsigned short IndicesType;

    // Variables needed for compression. BEGIN.
    // Indices, not pointers - because pointer to buffer is changing while writing to it.
    size_t idx_srcdata_begin = 0; // Index of buffer before writing mesh data. Also, index of begin of coordinates array in buffer.
    size_t idx_srcdata_normal = SIZE_MAX;// Index of begin of normals array in buffer. SIZE_MAX - mean that mesh has no normals.
    std::vector<size_t> idx_srcdata_tc;// Array of indices. Every index point to begin of texture coordinates array in buffer.
    size_t idx_srcdata_ind;// Index of begin of coordinates indices array in buffer.
    bool comp_allow;// Point that data of current mesh can be compressed.
    // Variables needed for compression. END.

    std::string fname = std::string(mFilename);
    std::string bufferIdPrefix = fname.substr(0, fname.rfind(".gltf"));
    std::string bufferId = mAsset->FindUniqueID("", bufferIdPrefix.c_str());

    Ref<Buffer> b = mAsset->GetBodyBuffer();
    if (!b) {
       b = mAsset->buffers.Create(bufferId);
    }

    //----------------------------------------
    // Initialize variables for the skin
    bool createSkin = false;
    for (unsigned int idx_mesh = 0; idx_mesh < mScene->mNumMeshes; ++idx_mesh) {
        const aiMesh* aim = mScene->mMeshes[idx_mesh];
        if(aim->HasBones()) {
            createSkin = true;
            break;
        }
    }

    Ref<Skin> skinRef;
    std::string skinName = mAsset->FindUniqueID("skin", "skin");
    std::vector<aiMatrix4x4> inverseBindMatricesData;
    if(createSkin) {
        skinRef = mAsset->skins.Create(skinName);
        skinRef->name = skinName;
    }
    //----------------------------------------

	for (unsigned int idx_mesh = 0; idx_mesh < mScene->mNumMeshes; ++idx_mesh) {
		const aiMesh* aim = mScene->mMeshes[idx_mesh];

		// Check if compressing requested and mesh can be encoded.
#ifdef ASSIMP_IMPORTER_GLTF_USE_OPEN3DGC
		comp_allow = mProperties->GetPropertyBool("extensions.Open3DGC.use", false);
#else
		comp_allow = false;
#endif

		if(comp_allow && (aim->mPrimitiveTypes == aiPrimitiveType_TRIANGLE) && (aim->mNumVertices > 0) && (aim->mNumFaces > 0))
		{
			idx_srcdata_tc.clear();
			idx_srcdata_tc.reserve(AI_MAX_NUMBER_OF_TEXTURECOORDS);
		}
		else
		{
			std::string msg;

			if(aim->mPrimitiveTypes != aiPrimitiveType_TRIANGLE)
				msg = "all primitives of the mesh must be a triangles.";
			else
				msg = "mesh must has vertices and faces.";

            ASSIMP_LOG_WARN_F("GLTF: can not use Open3DGC-compression: ", msg);
            comp_allow = false;
		}

        std::string meshId = mAsset->FindUniqueID(aim->mName.C_Str(), "mesh");
        Ref<Mesh> m = mAsset->meshes.Create(meshId);
        m->primitives.resize(1);
        Mesh::Primitive& p = m->primitives.back();

        p.material = mAsset->materials.Get(aim->mMaterialIndex);

		/******************* Vertices ********************/
		// If compression is used then you need parameters of uncompressed region: begin and size. At this step "begin" is stored.
		if(comp_allow) idx_srcdata_begin = b->byteLength;

        Ref<Accessor> v = ExportData(*mAsset, meshId, b, aim->mNumVertices, aim->mVertices, AttribType::VEC3, AttribType::VEC3, ComponentType_FLOAT);
		if (v) p.attributes.position.push_back(v);

		/******************** Normals ********************/
		if(comp_allow && (aim->mNormals != 0)) idx_srcdata_normal = b->byteLength;// Store index of normals array.

		Ref<Accessor> n = ExportData(*mAsset, meshId, b, aim->mNumVertices, aim->mNormals, AttribType::VEC3, AttribType::VEC3, ComponentType_FLOAT);
		if (n) p.attributes.normal.push_back(n);

		/************** Texture coordinates **************/
        for (int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
            // Flip UV y coords
            if (aim -> mNumUVComponents[i] > 1) {
                for (unsigned int j = 0; j < aim->mNumVertices; ++j) {
                    aim->mTextureCoords[i][j].y = 1 - aim->mTextureCoords[i][j].y;
                }
            }

            if (aim->mNumUVComponents[i] > 0) {
                AttribType::Value type = (aim->mNumUVComponents[i] == 2) ? AttribType::VEC2 : AttribType::VEC3;

				if(comp_allow) idx_srcdata_tc.push_back(b->byteLength);// Store index of texture coordinates array.

				Ref<Accessor> tc = ExportData(*mAsset, meshId, b, aim->mNumVertices, aim->mTextureCoords[i], AttribType::VEC3, type, ComponentType_FLOAT, false);
				if (tc) p.attributes.texcoord.push_back(tc);
			}
		}

		/*************** Vertices indices ****************/
		idx_srcdata_ind = b->byteLength;// Store index of indices array.

		if (aim->mNumFaces > 0) {
			std::vector<IndicesType> indices;
			unsigned int nIndicesPerFace = aim->mFaces[0].mNumIndices;
            indices.resize(aim->mNumFaces * nIndicesPerFace);
            for (size_t i = 0; i < aim->mNumFaces; ++i) {
                for (size_t j = 0; j < nIndicesPerFace; ++j) {
                    indices[i*nIndicesPerFace + j] = uint16_t(aim->mFaces[i].mIndices[j]);
                }
            }

			p.indices = ExportData(*mAsset, meshId, b, unsigned(indices.size()), &indices[0], AttribType::SCALAR, AttribType::SCALAR, ComponentType_UNSIGNED_SHORT, true);
		}

        switch (aim->mPrimitiveTypes) {
            case aiPrimitiveType_POLYGON:
                p.mode = PrimitiveMode_TRIANGLES; break; // TODO implement this
            case aiPrimitiveType_LINE:
                p.mode = PrimitiveMode_LINES; break;
            case aiPrimitiveType_POINT:
                p.mode = PrimitiveMode_POINTS; break;
            default: // aiPrimitiveType_TRIANGLE
                p.mode = PrimitiveMode_TRIANGLES;
        }

    /*************** Skins ****************/
    if(aim->HasBones()) {
        ExportSkin(*mAsset, aim, m, b, skinRef, inverseBindMatricesData);
    }

		/****************** Compression ******************/
		///TODO: animation: weights, joints.
		if(comp_allow)
		{
#ifdef ASSIMP_IMPORTER_GLTF_USE_OPEN3DGC
			// Only one type of compression supported at now - Open3DGC.
			//
			o3dgc::BinaryStream bs;
			o3dgc::SC3DMCEncoder<IndicesType> encoder;
			o3dgc::IndexedFaceSet<IndicesType> comp_o3dgc_ifs;
			o3dgc::SC3DMCEncodeParams comp_o3dgc_params;

			//
			// Fill data for encoder.
			//
			// Quantization
			unsigned quant_coord = mProperties->GetPropertyInteger("extensions.Open3DGC.quantization.POSITION", 12);
			unsigned quant_normal = mProperties->GetPropertyInteger("extensions.Open3DGC.quantization.NORMAL", 10);
			unsigned quant_texcoord = mProperties->GetPropertyInteger("extensions.Open3DGC.quantization.TEXCOORD", 10);

			// Prediction
			o3dgc::O3DGCSC3DMCPredictionMode prediction_position = o3dgc::O3DGC_SC3DMC_PARALLELOGRAM_PREDICTION;
			o3dgc::O3DGCSC3DMCPredictionMode prediction_normal =  o3dgc::O3DGC_SC3DMC_SURF_NORMALS_PREDICTION;
			o3dgc::O3DGCSC3DMCPredictionMode prediction_texcoord = o3dgc::O3DGC_SC3DMC_PARALLELOGRAM_PREDICTION;

			// IndexedFacesSet: "Crease angle", "solid", "convex" are set to default.
			comp_o3dgc_ifs.SetCCW(true);
			comp_o3dgc_ifs.SetIsTriangularMesh(true);
			comp_o3dgc_ifs.SetNumFloatAttributes(0);
			// Coordinates
			comp_o3dgc_params.SetCoordQuantBits(quant_coord);
			comp_o3dgc_params.SetCoordPredMode(prediction_position);
			comp_o3dgc_ifs.SetNCoord(aim->mNumVertices);
			comp_o3dgc_ifs.SetCoord((o3dgc::Real* const)&b->GetPointer()[idx_srcdata_begin]);
			// Normals
			if(idx_srcdata_normal != SIZE_MAX)
			{
				comp_o3dgc_params.SetNormalQuantBits(quant_normal);
				comp_o3dgc_params.SetNormalPredMode(prediction_normal);
				comp_o3dgc_ifs.SetNNormal(aim->mNumVertices);
				comp_o3dgc_ifs.SetNormal((o3dgc::Real* const)&b->GetPointer()[idx_srcdata_normal]);
			}

			// Texture coordinates
			for(size_t num_tc = 0; num_tc < idx_srcdata_tc.size(); num_tc++)
			{
				size_t num = comp_o3dgc_ifs.GetNumFloatAttributes();

				comp_o3dgc_params.SetFloatAttributeQuantBits(static_cast<unsigned long>(num), quant_texcoord);
				comp_o3dgc_params.SetFloatAttributePredMode(static_cast<unsigned long>(num), prediction_texcoord);
				comp_o3dgc_ifs.SetNFloatAttribute(static_cast<unsigned long>(num), aim->mNumVertices);// number of elements.
				comp_o3dgc_ifs.SetFloatAttributeDim(static_cast<unsigned long>(num), aim->mNumUVComponents[num_tc]);// components per element: aiVector3D => x * float
				comp_o3dgc_ifs.SetFloatAttributeType(static_cast<unsigned long>(num), o3dgc::O3DGC_IFS_FLOAT_ATTRIBUTE_TYPE_TEXCOORD);
				comp_o3dgc_ifs.SetFloatAttribute(static_cast<unsigned long>(num), (o3dgc::Real* const)&b->GetPointer()[idx_srcdata_tc[num_tc]]);
				comp_o3dgc_ifs.SetNumFloatAttributes(static_cast<unsigned long>(num + 1));
			}

			// Coordinates indices
			comp_o3dgc_ifs.SetNCoordIndex(aim->mNumFaces);
			comp_o3dgc_ifs.SetCoordIndex((IndicesType* const)&b->GetPointer()[idx_srcdata_ind]);
			// Prepare to encoding
			comp_o3dgc_params.SetNumFloatAttributes(comp_o3dgc_ifs.GetNumFloatAttributes());
			if(mProperties->GetPropertyBool("extensions.Open3DGC.binary", true))
				comp_o3dgc_params.SetStreamType(o3dgc::O3DGC_STREAM_TYPE_BINARY);
			else
				comp_o3dgc_params.SetStreamType(o3dgc::O3DGC_STREAM_TYPE_ASCII);

			comp_o3dgc_ifs.ComputeMinMax(o3dgc::O3DGC_SC3DMC_MAX_ALL_DIMS);
			//
			// Encoding
			//
			encoder.Encode(comp_o3dgc_params, comp_o3dgc_ifs, bs);
			// Replace data in buffer.
			b->ReplaceData(idx_srcdata_begin, b->byteLength - idx_srcdata_begin, bs.GetBuffer(), bs.GetSize());
			//
			// Add information about extension to mesh.
			//
			// Create extension structure.
			Mesh::SCompression_Open3DGC* ext = new Mesh::SCompression_Open3DGC;

			// Fill it.
			ext->Buffer = b->id;
			ext->Offset = idx_srcdata_begin;
			ext->Count = b->byteLength - idx_srcdata_begin;
			ext->Binary = mProperties->GetPropertyBool("extensions.Open3DGC.binary");
			ext->IndicesCount = comp_o3dgc_ifs.GetNCoordIndex() * 3;
			ext->VerticesCount = comp_o3dgc_ifs.GetNCoord();
			// And assign to mesh.
			m->Extension.push_back(ext);
#endif
		}// if(comp_allow)
	}// for (unsigned int i = 0; i < mScene->mNumMeshes; ++i)

    //----------------------------------------
    // Finish the skin
    // Create the Accessor for skinRef->inverseBindMatrices
    if (createSkin) {
        mat4* invBindMatrixData = new mat4[inverseBindMatricesData.size()];
        for ( unsigned int idx_joint = 0; idx_joint < inverseBindMatricesData.size(); ++idx_joint) {
            CopyValue(inverseBindMatricesData[idx_joint], invBindMatrixData[idx_joint]);
        }

        Ref<Accessor> invBindMatrixAccessor = ExportData(*mAsset, skinName, b, static_cast<unsigned int>(inverseBindMatricesData.size()), invBindMatrixData, AttribType::MAT4, AttribType::MAT4, ComponentType_FLOAT);
        if (invBindMatrixAccessor) skinRef->inverseBindMatrices = invBindMatrixAccessor;

        // Identity Matrix   =====>  skinRef->bindShapeMatrix
        // Temporary. Hard-coded identity matrix here
        skinRef->bindShapeMatrix.isPresent = true;
        IdentityMatrix4(skinRef->bindShapeMatrix.value);

        // Find node that contains this mesh and add "skeletons" and "skin" attributes to that node.
        Ref<Node> rootNode = mAsset->nodes.Get(unsigned(0));
        Ref<Node> meshNode;
        std::string meshID = mAsset->meshes.Get(unsigned(0))->id;
        FindMeshNode(rootNode, meshNode, meshID);

        Ref<Node> rootJoint = FindSkeletonRootJoint(skinRef);
        meshNode->skeletons.push_back(rootJoint);
        meshNode->skin = skinRef;
    }
}